

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O3

void field(LexState *ls,expdesc *v)

{
  FuncState *fs;
  TString *s;
  expdesc key;
  expdesc local_30;
  
  fs = ls->fs;
  luaK_exp2anyreg(fs,v);
  luaX_next(ls);
  s = str_checkname(ls);
  local_30.u.s.info = luaK_stringK(ls->fs,s);
  local_30.t = -1;
  local_30.f = -1;
  local_30.k = VK;
  luaK_indexed(fs,v,&local_30);
  return;
}

Assistant:

static void field (LexState *ls, expdesc *v) {
  /* field -> ['.' | ':'] NAME */
  FuncState *fs = ls->fs;
  expdesc key;
  luaK_exp2anyreg(fs, v);
  luaX_next(ls);  /* skip the dot or colon */
  checkname(ls, &key);
  luaK_indexed(fs, v, &key);
}